

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O0

pseudo_t linearize_statement(dmr_C *C,entrypoint *ep,statement *stmt)

{
  symbol *label_00;
  expression *peVar1;
  int iVar2;
  basic_block *pbVar3;
  instruction *insn;
  basic_block *pbVar4;
  multijmp *multijmp;
  expression *cond;
  basic_block *endif;
  basic_block *bb_false;
  basic_block *bb_true;
  multijmp *jmp;
  basic_block *bb_computed;
  ptr_list_iter symiter__;
  pseudo_t pseudo;
  basic_block *active;
  instruction *goto_ins;
  expression *expr;
  symbol *sym;
  symbol *label;
  basic_block *bb;
  statement *stmt_local;
  entrypoint *ep_local;
  dmr_C *C_local;
  
  if (stmt == (statement *)0x0) {
    return &C->L->void_pseudo;
  }
  pbVar3 = ep->active;
  if ((pbVar3 != (basic_block *)0x0) && (pbVar3->insns == (instruction_list *)0x0)) {
    pbVar3->pos = stmt->pos;
  }
  C->L->current_pos = stmt->pos;
  switch(stmt->type) {
  case STMT_NONE:
  default:
switchD_0014a5b5_default:
    C_local = (dmr_C *)&C->L->void_pseudo;
    break;
  case STMT_DECLARATION:
    C_local = (dmr_C *)linearize_declaration(C,ep,stmt);
    break;
  case STMT_EXPRESSION:
    C_local = (dmr_C *)linearize_expression(C,ep,(stmt->field_2).field_1.expression);
    break;
  case STMT_COMPOUND:
    if ((stmt->field_2).field_3.if_false == (statement *)0x0) {
      C_local = (dmr_C *)linearize_compound_statement(C,ep,stmt);
    }
    else {
      C_local = (dmr_C *)linearize_inlined_call(C,ep,stmt);
    }
    break;
  case STMT_IF:
    peVar1 = (stmt->field_2).field_1.expression;
    pbVar3 = alloc_basic_block(C,ep,stmt->pos);
    pbVar4 = alloc_basic_block(C,ep,stmt->pos);
    linearize_cond_branch(C,ep,peVar1,pbVar3,pbVar4);
    set_activeblock(C,ep,pbVar3);
    linearize_statement(C,ep,(stmt->field_2).field_3.if_true);
    cond = (expression *)pbVar4;
    if ((stmt->field_2).field_3.if_false != (statement *)0x0) {
      cond = (expression *)alloc_basic_block(C,ep,stmt->pos);
      add_goto(C,ep,(basic_block *)cond);
      set_activeblock(C,ep,pbVar4);
      linearize_statement(C,ep,(stmt->field_2).field_3.if_false);
    }
    set_activeblock(C,ep,(basic_block *)cond);
    goto switchD_0014a5b5_default;
  case STMT_RETURN:
    C_local = (dmr_C *)linearize_return(C,ep,stmt);
    break;
  case STMT_CASE:
    add_label(C,ep,(stmt->field_2).field_6.case_label);
    linearize_statement(C,ep,(stmt->field_2).field_3.if_false);
    goto switchD_0014a5b5_default;
  case STMT_SWITCH:
    C_local = (dmr_C *)linearize_switch(C,ep,stmt);
    break;
  case STMT_ITERATOR:
    C_local = (dmr_C *)linearize_iterator(C,ep,stmt);
    break;
  case STMT_LABEL:
    label_00 = (stmt->field_2).field_5.label_identifier;
    if ((*(uint *)label_00 >> 0x11 & 1) != 0) {
      add_label(C,ep,label_00);
    }
    C_local = (dmr_C *)linearize_statement(C,ep,(stmt->field_2).field_3.if_true);
    break;
  case STMT_GOTO:
    pbVar3 = ep->active;
    iVar2 = dmrC_bb_reachable(pbVar3);
    if (iVar2 != 0) {
      if ((stmt->field_2).field_1.expression == (expression *)0x0) {
        peVar1 = (stmt->field_2).field_1.context;
        if (peVar1 != (expression *)0x0) {
          if ((undefined1  [64])((undefined1  [64])*peVar1 & (undefined1  [64])0xff) ==
              (undefined1  [64])0x17) {
            pbVar3 = get_bound_block(C,ep,(peVar1->field_5).field_4.symbol);
            add_goto(C,ep,pbVar3);
          }
          else {
            symiter__._16_8_ = linearize_expression(C,ep,peVar1);
            insn = alloc_instruction(C,7,0);
            dmrC_use_pseudo(C,insn,(pseudo_t)symiter__._16_8_,&(insn->field_5).target);
            add_one_insn(C,ep,insn);
            ptrlist_forward_iterator
                      ((ptr_list_iter *)&bb_computed,(ptr_list *)(stmt->field_2).field_3.if_false);
            expr = (expression *)ptrlist_iter_next((ptr_list_iter *)&bb_computed);
            while (expr != (expression *)0x0) {
              pbVar4 = get_bound_block(C,ep,(symbol *)expr);
              multijmp = alloc_multijmp(C,pbVar4,1,0);
              dmrC_add_multijmp(C,(multijmp_list **)&(insn->field_6).field_0,multijmp);
              dmrC_add_bb(C,&pbVar4->parents,ep->active);
              dmrC_add_bb(C,&pbVar3->children,pbVar4);
              expr = (expression *)ptrlist_iter_next((ptr_list_iter *)&bb_computed);
            }
            finish_block(ep);
          }
        }
      }
      else {
        pbVar3 = get_bound_block(C,ep,(stmt->field_2).field_5.label_identifier);
        add_goto(C,ep,pbVar3);
      }
    }
    goto switchD_0014a5b5_default;
  case STMT_ASM:
    C_local = (dmr_C *)linearize_asm_statement(C,ep,stmt);
    break;
  case STMT_CONTEXT:
    C_local = (dmr_C *)linearize_context(C,ep,stmt);
    break;
  case STMT_RANGE:
    C_local = (dmr_C *)linearize_range(C,ep,stmt);
  }
  return (pseudo_t)C_local;
}

Assistant:

static pseudo_t linearize_statement(struct dmr_C *C, struct entrypoint *ep, struct statement *stmt)
{
	struct basic_block *bb;

	if (!stmt)
		return VOID_PSEUDO(C);

	bb = ep->active;
	if (bb && !bb->insns)
		bb->pos = stmt->pos;
	C->L->current_pos = stmt->pos;

	switch (stmt->type) {
	case STMT_NONE:
		break;

	case STMT_DECLARATION:
		return linearize_declaration(C, ep, stmt);

	case STMT_CONTEXT:
		return linearize_context(C, ep, stmt);

	case STMT_RANGE:
		return linearize_range(C, ep, stmt);

	case STMT_EXPRESSION:
		return linearize_expression(C, ep, stmt->expression);

	case STMT_ASM:
		return linearize_asm_statement(C, ep, stmt);

	case STMT_RETURN:
		return linearize_return(C, ep, stmt);

	case STMT_CASE: {
		add_label(C, ep, stmt->case_label);
		linearize_statement(C, ep, stmt->case_statement);
		break;
	}

	case STMT_LABEL: {
		struct symbol *label = stmt->label_identifier;

		if (label->used) {
			bb = add_label(C, ep, label);
		}
		return 	linearize_statement(C, ep, stmt->label_statement);
	}

	case STMT_GOTO: {
		struct symbol *sym;
		struct expression *expr;
		struct instruction *goto_ins;
		struct basic_block *active;
		pseudo_t pseudo;

		active = ep->active;
		if (!dmrC_bb_reachable(active))
			break;

		if (stmt->goto_label) {
			add_goto(C, ep, get_bound_block(C, ep, stmt->goto_label));
			break;
		}

		expr = stmt->goto_expression;
		if (!expr)
			break;

		/* This can happen as part of simplification */
		if (expr->type == EXPR_LABEL) {
			add_goto(C, ep, get_bound_block(C, ep, expr->label_symbol));
			break;
		}

		pseudo = linearize_expression(C, ep, expr);
		goto_ins = alloc_instruction(C, OP_COMPUTEDGOTO, 0);
		dmrC_use_pseudo(C, goto_ins, pseudo, &goto_ins->target);
		add_one_insn(C, ep, goto_ins);

		FOR_EACH_PTR(stmt->target_list, sym) {
			struct basic_block *bb_computed = get_bound_block(C, ep, sym);
			struct multijmp *jmp = alloc_multijmp(C, bb_computed, 1, 0);
			dmrC_add_multijmp(C, &goto_ins->multijmp_list, jmp);
			dmrC_add_bb(C, &bb_computed->parents, ep->active);
			dmrC_add_bb(C, &active->children, bb_computed);
		} END_FOR_EACH_PTR(sym);

		finish_block(ep);
		break;
	}

	case STMT_COMPOUND:
		if (stmt->inline_fn)
			return linearize_inlined_call(C, ep, stmt);
		return linearize_compound_statement(C, ep, stmt);

	/*
	 * This could take 'likely/unlikely' into account, and
	 * switch the arms around appropriately..
	 */
	case STMT_IF: {
		struct basic_block *bb_true, *bb_false, *endif;
 		struct expression *cond = stmt->if_conditional;

		bb_true = alloc_basic_block(C, ep, stmt->pos);
		bb_false = endif = alloc_basic_block(C, ep, stmt->pos);

 		linearize_cond_branch(C, ep, cond, bb_true, bb_false);

		set_activeblock(C, ep, bb_true);
 		linearize_statement(C, ep, stmt->if_true);
 
 		if (stmt->if_false) {
			endif = alloc_basic_block(C, ep, stmt->pos);
			add_goto(C, ep, endif);
			set_activeblock(C, ep, bb_false);
 			linearize_statement(C, ep, stmt->if_false);
		}
		set_activeblock(C, ep, endif);
		break;
	}

	case STMT_SWITCH:
		return linearize_switch(C, ep, stmt);

	case STMT_ITERATOR:
		return linearize_iterator(C, ep, stmt);

	default:
		break;
	}
	return VOID_PSEUDO(C);
}